

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int loop_invariant_p(gen_ctx_t gen_ctx,loop_node_t_conflict loop,bb_insn_t_conflict bb_insn,
                    bitmap_t loop_invariant_insn_bitmap)

{
  char cVar1;
  uint uVar2;
  MIR_insn_t pMVar3;
  void *pvVar4;
  long lVar5;
  MIR_insn_t pMVar6;
  int iVar7;
  ulong uVar8;
  loop_node_t plVar9;
  int iVar10;
  anon_union_32_12_57d33f68_for_u *paVar11;
  int op_num;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  int local_60;
  MIR_reg_t local_5c;
  ulong local_58;
  insn_var_iterator_t local_50;
  
  pMVar3 = bb_insn->insn;
  uVar2 = (uint)*(ulong *)&pMVar3->field_0x18;
  iVar10 = 0;
  iVar7 = 0;
  if (((uVar2 - 0xa5 < 0xffffffd1) &&
      ((((iVar7 = iVar10, 0x14 < uVar2 - 0xa6 || ((0x104071U >> (uVar2 - 0xa6 & 0x1f) & 1) == 0)) &&
        (uVar2 - 0xaa < 0xfffffffd)) &&
       ((0x3b < uVar2 || ((0xf1e000000000000U >> (*(ulong *)&pMVar3->field_0x18 & 0x3f) & 1) == 0)))
       ))) && (6 < uVar2 - 0xad)) {
    if (*(int *)&pMVar3->field_0x1c != 0) {
      uVar8 = 0;
      pMVar6 = pMVar3;
      do {
        paVar11 = &pMVar6->ops[0].u;
        cVar1 = pMVar6->ops[0].field_0x8;
        if (cVar1 == '\x02') {
          local_58 = uVar8;
          iVar7 = bitmap_bit_p(gen_ctx->tied_regs,(ulong)paVar11->reg);
          uVar8 = local_58;
          if (iVar7 != 0) {
            return 0;
          }
        }
        else if (cVar1 == '\v') {
          return 0;
        }
        uVar8 = uVar8 + 1;
        pMVar6 = (MIR_insn_t)paVar11;
      } while (uVar8 < *(uint *)&pMVar3->field_0x1c);
    }
    local_50.nops = (size_t)*(uint *)&pMVar3->field_0x1c;
    local_50.op_num = 0;
    local_50.op_part_num = 0;
    local_50.insn = pMVar3;
    iVar7 = input_insn_var_iterator_next(gen_ctx,&local_50,&local_5c,&local_60);
    if (iVar7 != 0) {
      do {
        pvVar4 = pMVar3->ops[local_60].data;
        if (pvVar4 == (void *)0x0) {
          __assert_fail("se != ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x14bf,"int loop_invariant_p(gen_ctx_t, loop_node_t, bb_insn_t, bitmap_t)")
          ;
        }
        lVar5 = *(long *)((long)pvVar4 + 8);
        if (loop_invariant_insn_bitmap == (bitmap_t)0x0) {
LAB_0016b015:
          plVar9 = loop;
          do {
            plVar9 = plVar9->parent;
            if (plVar9 == (loop_node_t)0x0) {
              return 0;
            }
          } while (plVar9 != *(loop_node_t *)(*(long *)(*(long *)(lVar5 + 0x30) + 0x98) + 0x18));
        }
        else {
          uVar2 = *(uint *)(lVar5 + 0xc);
          if ((loop_invariant_insn_bitmap->els_num << 6 <= (ulong)uVar2) ||
             ((loop_invariant_insn_bitmap->varr[uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) == 0))
          goto LAB_0016b015;
        }
        iVar7 = input_insn_var_iterator_next(gen_ctx,&local_50,&local_5c,&local_60);
      } while (iVar7 != 0);
    }
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int loop_invariant_p (gen_ctx_t gen_ctx, loop_node_t loop, bb_insn_t bb_insn,
                             bitmap_t loop_invariant_insn_bitmap) {
  MIR_insn_t insn = bb_insn->insn;
  bb_t bb = bb_insn->bb;
  loop_node_t curr_loop;
  int op_num;
  MIR_reg_t var;
  ssa_edge_t se;
  insn_var_iterator_t iter;

  if (MIR_any_branch_code_p (insn->code) || insn->code == MIR_PHI || insn->code == MIR_RET
      || insn->code == MIR_JRET || insn->code == MIR_LABEL || MIR_call_code_p (insn->code)
      || insn->code == MIR_ALLOCA || insn->code == MIR_BSTART || insn->code == MIR_BEND
      || insn->code == MIR_VA_START || insn->code == MIR_VA_ARG || insn->code == MIR_VA_BLOCK_ARG
      || insn->code == MIR_VA_END
      /* possible exception insns: */
      || insn->code == MIR_DIV || insn->code == MIR_DIVS || insn->code == MIR_UDIV
      || insn->code == MIR_UDIVS || insn->code == MIR_MOD || insn->code == MIR_MODS
      || insn->code == MIR_UMOD || insn->code == MIR_UMODS)
    return FALSE;
  for (size_t i = 0; i < insn->nops; i++) {
    if (insn->ops[i].mode == MIR_OP_VAR_MEM) return FALSE;
    if (insn->ops[i].mode == MIR_OP_VAR && bitmap_bit_p (tied_regs, insn->ops[i].u.var))
      return FALSE;
  }
  FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
    se = insn->ops[op_num].data;
    gen_assert (se != NULL);
    bb_insn = se->def;
    if (loop_invariant_insn_bitmap != NULL
        && bitmap_bit_p (loop_invariant_insn_bitmap, bb_insn->index))
      continue;
    bb = bb_insn->bb;
    for (curr_loop = loop->parent; curr_loop != NULL; curr_loop = curr_loop->parent)
      if (curr_loop == bb->loop_node->parent) break;
    if (curr_loop == NULL) return FALSE;
  }
  return TRUE;
}